

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<int>::InsertSub
          (TPZMatrix<int> *this,int64_t sRow,int64_t sCol,int64_t rowSize,int64_t colSize,
          int64_t pRow,int64_t pCol,TPZMatrix<int> *pA)

{
  int iVar1;
  long lVar2;
  int64_t iVar3;
  int local_5c;
  int64_t local_58;
  long local_50;
  long local_48;
  long local_40;
  int64_t local_38;
  
  local_40 = pRow + rowSize;
  local_38 = sCol;
  if (local_40 <= (pA->super_TPZBaseMatrix).fRow) {
    local_48 = pCol;
    if (pCol + colSize <= (pA->super_TPZBaseMatrix).fCol) {
      local_50 = colSize;
      if (0 < rowSize) {
        do {
          lVar2 = local_48;
          iVar3 = local_38;
          local_58 = pRow;
          if (0 < local_50) {
            do {
              local_5c = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                                   (this,sRow,iVar3);
              (*(pA->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                        (pA,local_58,lVar2,&local_5c);
              lVar2 = lVar2 + 1;
              iVar3 = iVar3 + 1;
            } while (lVar2 < pCol + colSize);
          }
          pRow = local_58 + 1;
          sRow = sRow + 1;
        } while (pRow < local_40);
      }
      return 1;
    }
  }
  iVar1 = Error("InsertSub <the sub-matrix is too big that target>",(char *)0x0);
  return iVar1;
}

Assistant:

int TPZMatrix<TVar>::InsertSub(const int64_t sRow,const int64_t sCol,const int64_t rowSize,
							   const int64_t colSize,const int64_t pRow,const int64_t pCol, TPZMatrix<TVar> *pA ) const {
	
	
    if ( ((pRow + rowSize) > pA->Rows()) || ((pCol + colSize) > pA->Cols())) {
        return( Error( "InsertSub <the sub-matrix is too big that target>" ) );
    }
	
    int64_t NewRowSize = rowSize+pRow;
    int64_t NewColSize = colSize+pCol;
	
	
    int64_t row = sRow;
    for ( int64_t r = pRow; r < NewRowSize; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = pCol ; c < NewColSize; c++, col++ ) {
            pA->PutVal( r, c, GetVal( row, col ) );
        }
    }
    return( 1 );
}